

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_Tent_Test::TestBody(Sampling_Tent_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float *pfVar9;
  size_t sVar10;
  bool bVar11;
  uint uVar12;
  Allocator AVar13;
  byte bVar14;
  int iVar15;
  char *pcVar16;
  char *in_R9;
  uint64_t oldstate;
  ulong uVar17;
  undefined1 auVar18 [16];
  Float FVar19;
  float fVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  span<const_float> f;
  Float radius;
  AssertionResult gtest_ar_;
  Float dp;
  AssertionResult gtest_ar_1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Float dist;
  AssertionResult gtest_ar;
  AssertHelper local_168;
  Float local_15c;
  long *local_158;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  undefined1 local_148 [16];
  float local_12c;
  string local_128;
  undefined1 local_108 [16];
  Float local_ec;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_e8;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8 [16];
  long local_98;
  AssertHelper local_90;
  float local_84;
  PiecewiseConstant1D local_80;
  
  local_148._0_4_ = pbrt::SampleTent(0.501,1.0);
  FVar19 = pbrt::SampleTent(0.499,1.0);
  local_e8.alloc.memoryResource = (memory_resource *)&DAT_3f847ae147ae147b;
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  auVar18 = vandps_avx512vl(ZEXT416((uint)((float)local_148._0_4_ - FVar19)),auVar18);
  local_84 = auVar18._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_80,"dist",".01",&local_84,(double *)&local_e8);
  if ((char)local_80.func.alloc.memoryResource == '\0') {
    testing::Message::Message((Message *)&local_e8);
    if (local_80.func.ptr == (float *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_80.func.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x2c6,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if (local_e8.alloc.memoryResource != (memory_resource *)0x0) {
      bVar11 = testing::internal::IsTrue(true);
      if ((bVar11) && (local_e8.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_e8.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80.func.ptr,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar17 = 0x853c49e6748fea9b;
  local_98 = 0;
  do {
    local_c8._8_8_ = 0;
    local_15c = *(Float *)((long)&DAT_0060eaa8 + local_98);
    local_c8._M_unused._M_object = &local_15c;
    local_b0 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:715:21)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:715:21)>
               ::_M_manager;
    local_148 = ZEXT416((uint)local_15c);
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    local_108 = vxorps_avx512vl(local_148,auVar3);
    AVar13.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&local_e8,(function<float_(float)> *)&local_c8,0x2000,0x40,(Float)local_108._0_4_,
               (Float)local_148._0_4_,AVar13);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    sVar10 = local_e8.nStored;
    pfVar9 = local_e8.ptr;
    local_148 = ZEXT416((uint)local_15c);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    local_108 = vxorps_avx512vl(local_148,auVar4);
    AVar13.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar10;
    f.ptr = pfVar9;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              (&local_80,f,(Float)local_108._0_4_,(Float)local_148._0_4_,AVar13);
    iVar15 = 100;
    do {
      uVar12 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
      bVar14 = (byte)(uVar17 >> 0x3b);
      auVar8._8_8_ = in_XMM6_Qb;
      auVar8._0_8_ = in_XMM6_Qa;
      auVar18 = vcvtusi2ss_avx512f(auVar8,uVar12 >> bVar14 | uVar12 << 0x20 - bVar14);
      auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      local_108._0_4_ = auVar18._0_4_;
      local_148._0_4_ = pbrt::SampleTent(auVar18._0_4_,local_15c);
      local_148._4_4_ = extraout_XMM0_Db;
      local_148._8_4_ = extraout_XMM0_Dc;
      local_148._12_4_ = extraout_XMM0_Dd;
      local_a8._0_4_ = local_15c;
      local_ec = pbrt::PiecewiseConstant1D::Sample
                           (&local_80,(Float)local_108._0_4_,&local_12c,(int *)0x0);
      local_158 = (long *)&DAT_3f689374bc6a7efa;
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(ZEXT416((uint)((float)local_148._0_4_ - local_ec)),auVar5);
      local_168.data_._0_4_ = auVar18._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_128,"std::abs(tx - dx)","3e-3",(float *)&local_168,
                 (double *)&local_158);
      if ((char)local_128._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_158);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_158 + 2),"Closed form = ",0xe);
        std::ostream::_M_insert<double>((double)(float)local_148._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_158 + 2),", distrib = ",0xc);
        std::ostream::_M_insert<double>((double)local_ec);
        pcVar16 = "";
        if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
          pcVar16 = *(char **)local_128._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x2d6,pcVar16);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_158 != (long *)0x0) {
          bVar11 = testing::internal::IsTrue(true);
          if ((bVar11) && (local_158 != (long *)0x0)) {
            (**(code **)(*local_158 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx(auVar21,local_148);
      local_158 = (long *)&DAT_3f689374bc6a7efa;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)local_a8._0_4_),auVar18,6);
      fVar20 = (float)((uint)((byte)uVar2 & 1) *
                      (int)(1.0 / (float)local_a8._0_4_ -
                           auVar18._0_4_ / ((float)local_a8._0_4_ * (float)local_a8._0_4_)));
      local_a8 = ZEXT416((uint)fVar20);
      auVar18 = vandps_avx(ZEXT416((uint)(fVar20 - local_12c)),auVar21);
      local_168.data_._0_4_ = auVar18._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_128,"std::abs(tp - dp)","3e-3",(float *)&local_168,
                 (double *)&local_158);
      if ((char)local_128._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_158);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_158 + 2),"Closed form PDF = ",0x12);
        std::ostream::_M_insert<double>((double)(float)local_a8._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_158 + 2),", distrib PDF = ",0x10);
        std::ostream::_M_insert<double>((double)local_12c);
        pcVar16 = "";
        if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
          pcVar16 = *(char **)local_128._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x2d8,pcVar16);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_158 != (long *)0x0) {
          bVar11 = testing::internal::IsTrue(true);
          if ((bVar11) && (local_158 != (long *)0x0)) {
            (**(code **)(*local_158 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_148._0_4_ <= 0.0) {
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar18 = vxorps_avx512vl(local_148,auVar7);
        fVar20 = auVar18._0_4_ / local_15c;
        fVar20 = (1.0 - fVar20 * ((2.0 - fVar20) + fVar20 * 0.0)) * 0.5;
      }
      else {
        fVar20 = local_148._0_4_ / local_15c;
        fVar20 = fVar20 * ((2.0 - fVar20) + fVar20 * 0.0) * 0.5 + 0.5;
      }
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx(ZEXT416((uint)fVar20),auVar22);
      auVar18 = vminss_avx(auVar18,ZEXT416((uint)local_108._0_4_));
      fVar1 = (float)local_108._0_4_ - fVar20;
      bVar11 = auVar18._0_4_ < 0.01;
      auVar18 = vandps_avx(ZEXT416((uint)bVar11 * (int)fVar1 +
                                   (uint)!bVar11 *
                                   (int)((fVar1 + fVar1) / ((float)local_108._0_4_ + fVar20))),
                           auVar22);
      local_158 = (long *)CONCAT71(local_158._1_7_,auVar18._0_4_ <= 0.01);
      local_150.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (0.01 < auVar18._0_4_) {
        testing::Message::Message((Message *)&local_168);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 0x10),"u ",2)
        ;
        std::ostream::_M_insert<double>((double)(float)local_108._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 0x10),
                   " radius ",8);
        std::ostream::_M_insert<double>((double)local_15c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 0x10)," x ",3
                  );
        std::ostream::_M_insert<double>((double)(float)local_148._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 0x10),
                   " inverse ",9);
        if (local_148._0_4_ <= 0.0) {
          auVar6._8_4_ = 0x80000000;
          auVar6._0_8_ = 0x8000000080000000;
          auVar6._12_4_ = 0x80000000;
          auVar18 = vxorps_avx512vl(local_148,auVar6);
          fVar20 = auVar18._0_4_ / local_15c;
          fVar20 = (1.0 - fVar20 * ((2.0 - fVar20) + fVar20 * 0.0)) * 0.5;
        }
        else {
          fVar20 = local_148._0_4_ / local_15c;
          fVar20 = fVar20 * ((2.0 - fVar20) + fVar20 * 0.0) * 0.5 + 0.5;
        }
        std::ostream::_M_insert<double>((double)fVar20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_128,(internal *)&local_158,
                   (AssertionResult *)"checkErr(u, InvertTentSample(tx, radius))","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x2e3,(char *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                           (char)local_128._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
            &local_128.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p
                                  ),local_128.field_2._M_allocated_capacity + 1);
        }
        if (CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) != 0) {
          bVar11 = testing::internal::IsTrue(true);
          if ((bVar11) &&
             ((long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar17 = uVar17 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    local_80.cdf.nStored = 0;
    (*(local_80.cdf.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.cdf.alloc.memoryResource,local_80.cdf.ptr,local_80.cdf.nAlloc << 2,4);
    local_80.func.nStored = 0;
    (**(code **)(*(long *)CONCAT71(local_80.func.alloc.memoryResource._1_7_,
                                   (char)local_80.func.alloc.memoryResource) + 0x18))
              ((long *)CONCAT71(local_80.func.alloc.memoryResource._1_7_,
                                (char)local_80.func.alloc.memoryResource),local_80.func.ptr,
               local_80.func.nAlloc << 2,4);
    local_e8.nStored = 0;
    (*(local_e8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_e8.alloc.memoryResource,local_e8.ptr,local_e8.nAlloc << 2,4);
    local_98 = local_98 + 4;
  } while (local_98 != 0xc);
  return;
}

Assistant:

TEST(Sampling, Tent) {
    // Make sure stratification is preserved at the midpoint of the
    // sampling domain.
    Float dist = std::abs(SampleTent(.501, 1) - SampleTent(.499, 1));
    EXPECT_LT(dist, .01);

    Float rad[] = {Float(1), Float(2.5), Float(.125)};
    RNG rng;
    for (Float radius : rad) {
        auto tent = [&](Float x) { return std::max<Float>(0, 1 - std::abs(x) / radius); };

        auto values = Sample1DFunction(tent, 8192, 64, -radius, radius);
        PiecewiseConstant1D distrib(values, -radius, radius);
        for (int i = 0; i < 100; ++i) {
            Float u = rng.Uniform<Float>();
            Float tx = SampleTent(u, radius);
            Float tp = TentPDF(tx, radius);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(tx - dx), 3e-3)
                << "Closed form = " << tx << ", distrib = " << dx;
            EXPECT_LT(std::abs(tp - dp), 3e-3)
                << "Closed form PDF = " << tp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTentSample(tx, radius)))
                << "u " << u << " radius " << radius << " x " << tx << " inverse "
                << InvertTentSample(tx, radius);
        }
    }
}